

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

ExecutionResult * __thiscall
SchemeSpecialForm::execute
          (ExecutionResult *__return_storage_ptr__,SchemeSpecialForm *this,
          list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *l,
          Context *context)

{
  function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>
  fStack_48;
  
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
  pop_front(l);
  Registry<std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
  ::get(&fStack_48,&this->name);
  std::
  function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>
  ::operator()(__return_storage_ptr__,&fStack_48,l,context);
  std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult SchemeSpecialForm::execute(std::list<std::shared_ptr<ASTNode>> l, const Context &context)
{
    l.pop_front();
    return SpecialFormRegistry::get(name)(l, context);
}